

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O2

void parseACOFile(filebuf *file)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  ushort uVar5;
  char buf [10];
  
  lVar1 = (**(code **)(*(long *)file + 0x40))(file,buf,2);
  if (lVar1 == 2) {
    if ((ushort)(buf._0_2_ << 8 | (ushort)buf._0_2_ >> 8) == 1) {
      lVar1 = (**(code **)(*(long *)file + 0x40))(file,buf,2);
      if (lVar1 == 2) {
        uVar5 = buf._0_2_ << 8 | (ushort)buf._0_2_ >> 8;
        if ((ushort)((ushort)options.nbPalettes * (ushort)options.nbColorsPerPal) < uVar5) {
          warning("ACO file contains %u colors, but there can only be %u; ignoring extra");
          uVar5 = (ushort)options.nbPalettes * (ushort)options.nbColorsPerPal;
        }
        if (options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          options.palSpec.
          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl
          .super__Vector_impl_data._M_finish =
               options.palSpec.
               super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        uVar2 = 0;
        do {
          if (uVar5 == (ushort)uVar2) {
            return;
          }
          lVar1 = (**(code **)(*(long *)file + 0x40))(file,buf,10);
          if (lVar1 != 10) {
            pcVar4 = "Failed to read color #%u from palette file";
            uVar3 = (ulong)(uVar2 + 1);
LAB_0010c4b1:
            error(pcVar4,uVar3);
            return;
          }
          if ((short)((uVar2 & 0xffff) % (uint)options.nbColorsPerPal) == 0) {
            std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
            emplace_back<>(&options.palSpec);
          }
          uVar3 = (ulong)CONCAT11(buf[0],buf[1]);
          switch(uVar3) {
          case 0:
            options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1]._M_elems
            [(ushort)((uVar2 & 0xffff) % (uint)options.nbColorsPerPal)] =
                 (Rgba)(CONCAT12(buf[4],CONCAT11(buf[2],buf[0])) | 0xff000000);
            uVar2 = uVar2 + 1;
            break;
          case 1:
            pcVar4 = "Unsupported color type (HSB) for ACO file";
            goto LAB_0010c463;
          case 2:
            pcVar4 = "Unsupported color type (CMYK) for ACO file";
            goto LAB_0010c463;
          default:
            pcVar4 = "Unknown color type (%u) for ACO file";
            goto LAB_0010c4b1;
          case 7:
            pcVar4 = "Unsupported color type (lab) for ACO file";
            goto LAB_0010c463;
          case 8:
            pcVar4 = "Unsupported color type (grayscale) for ACO file";
            goto LAB_0010c463;
          }
        } while( true );
      }
      pcVar4 = "Couldn\'t read number of colors in palette file";
    }
    else {
      pcVar4 = "Palette file does not appear to be an ACO file";
    }
  }
  else {
    pcVar4 = "Couldn\'t read ACO file version";
  }
LAB_0010c463:
  error(pcVar4);
  return;
}

Assistant:

static void parseACOFile(std::filebuf &file) {
	// https://www.adobe.com/devnet-apps/photoshop/fileformatashtml/#50577411_pgfId-1055819
	// http://www.nomodes.com/aco.html

	char buf[10];

	if (file.sgetn(buf, 2) != 2) {
		error("Couldn't read ACO file version");
		return;
	}
	if (readBE<uint16_t>(buf) != 1) {
		error("Palette file does not appear to be an ACO file");
		return;
	}

	if (file.sgetn(buf, 2) != 2) {
		error("Couldn't read number of colors in palette file");
		return;
	}
	uint16_t nbColors = readBE<uint16_t>(buf);

	if (nbColors > options.nbColorsPerPal * options.nbPalettes) {
		warning("ACO file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        nbColors, options.nbColorsPerPal * options.nbPalettes);
		nbColors = options.nbColorsPerPal * options.nbPalettes;
	}

	options.palSpec.clear();

	for (uint16_t i = 0; i < nbColors; ++i) {
		if (file.sgetn(buf, 10) != 10) {
			error("Failed to read color #%" PRIu16 " from palette file", i + 1);
			return;
		}

		if (i % options.nbColorsPerPal == 0) {
			options.palSpec.emplace_back();
		}

		Rgba &color = options.palSpec.back()[i % options.nbColorsPerPal];
		uint16_t colorType = readBE<uint16_t>(buf);
		switch (colorType) {
		case 0: // RGB
			color = Rgba(buf[0], buf[2], buf[4], 0xFF);
			break;
		case 1: // HSB
			error("Unsupported color type (HSB) for ACO file");
			return;
		case 2: // CMYK
			error("Unsupported color type (CMYK) for ACO file");
			return;
		case 7: // Lab
			error("Unsupported color type (lab) for ACO file");
			return;
		case 8: // Grayscale
			error("Unsupported color type (grayscale) for ACO file");
			return;
		default:
			error("Unknown color type (%" PRIu16 ") for ACO file", colorType);
			return;
		}
	}

	// TODO: maybe scan the v2 data instead (if present)
	// `codecvt` can be used to convert from UTF-16 to UTF-8
}